

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::composeUTF8
          (Normalizer2Impl *this,uint32_t options,UBool onlyContiguous,uint8_t *src,uint8_t *limit,
          ByteSink *sink,Edits *edits,UErrorCode *errorCode)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  UBool UVar5;
  UChar UVar6;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  UChar32 UVar11;
  byte *pbVar12;
  byte bVar13;
  byte bVar14;
  byte *limit_00;
  UCPTrie *pUVar15;
  int iVar16;
  byte *pbVar17;
  uint newLength;
  uint uVar18;
  byte *pbVar19;
  long lVar20;
  ReorderingBuffer buffer;
  UnicodeString s16;
  byte local_d9;
  byte *local_d8;
  byte local_c0;
  ReorderingBuffer local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  UVar6 = this->minCompNoMaybeCP;
  if (0x7f < (ushort)UVar6) {
    local_d9 = 0xe0;
    if (0x7ff < (ushort)UVar6) goto LAB_002984cf;
    UVar6 = (UChar)(byte)((byte)((ushort)UVar6 >> 6) | 0xc0);
  }
  local_d9 = (byte)UVar6;
LAB_002984cf:
  pbVar19 = src;
  if (src != limit) {
    do {
      while( true ) {
        bVar14 = *pbVar19;
        uVar7 = (uint)bVar14;
        pbVar17 = pbVar19 + 1;
        limit_00 = pbVar17;
        if (local_d9 <= bVar14) break;
LAB_0029864b:
        pbVar19 = limit_00;
        if (limit_00 == limit) goto LAB_00299013;
      }
      if ((char)bVar14 < '\0') {
        if (pbVar17 != limit) {
          uVar7 = (uint)bVar14;
          if (bVar14 < 0xe0) {
            if ((0xc1 < bVar14) && ((byte)(*pbVar17 ^ 0x80) < 0x40)) {
              uVar7 = (uint)this->normTrie->index[uVar7 & 0x1f] + (*pbVar17 ^ 0x80);
LAB_002985b1:
              limit_00 = limit_00 + 1;
              goto LAB_00298632;
            }
          }
          else if (bVar14 < 0xf0) {
            if (((((byte)" 000000000000\x1000"[uVar7 & 0xf] >> (*pbVar17 >> 5) & 1) != 0) &&
                (limit_00 = pbVar19 + 2, limit_00 != limit)) && ((byte)(*limit_00 ^ 0x80) < 0x40)) {
              uVar7 = (uint)*(ushort *)
                             ((long)this->normTrie->index +
                             (ulong)((uVar7 & 0xf) * 0x80 + (*pbVar17 & 0x3f) * 2)) +
                      (*limit_00 ^ 0x80);
              goto LAB_002985b1;
            }
          }
          else if (bVar14 < 0xf5) {
            if ((((((uint)(int)""[*pbVar17 >> 4] >> (uVar7 - 0xf0 & 0x1f) & 1) != 0) &&
                 (pbVar12 = pbVar19 + 2, limit_00 = pbVar12, pbVar12 != limit)) &&
                ((byte)(*pbVar12 + 0x80) < 0x40)) &&
               ((limit_00 = pbVar19 + 3, limit_00 != limit && ((byte)(*limit_00 + 0x80) < 0x40)))) {
              uVar7 = *pbVar17 & 0x3f | (uVar7 - 0xf0) * 0x40;
              pUVar15 = this->normTrie;
              if (uVar7 < pUVar15->shifted12HighStart) {
                uVar7 = ucptrie_internalSmallU8Index_63
                                  (pUVar15,uVar7,*pbVar12 + 0x80,*limit_00 + 0x80);
              }
              else {
                uVar7 = pUVar15->dataLength - 2;
              }
              goto LAB_002985b1;
            }
          }
        }
        uVar7 = this->normTrie->dataLength - 1;
      }
LAB_00298632:
      uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar7 * 2);
      if (uVar2 < this->minNoNo) goto LAB_0029864b;
      uVar7 = (uint)uVar2;
      iVar9 = (int)limit_00;
      pbVar12 = limit_00;
      local_d8 = limit_00;
      if (uVar2 < this->minMaybeYes) {
        if (sink == (ByteSink *)0x0) goto LAB_0029908d;
        uVar10 = (uint)pbVar19;
        if (uVar2 < this->limitNoNo) {
          if (uVar2 < this->minNoNoCompBoundaryBefore) {
            if ((((uVar2 & 1) == 0) ||
                (((onlyContiguous != '\0' && (uVar2 != 1)) &&
                 (0x1ff < *(ushort *)((long)this->extraData + (ulong)(uVar7 & 0xfffffffe)))))) &&
               (UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 == '\0'))
            goto LAB_00298a8d;
            if (((src == pbVar19) ||
                (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode),
                UVar5 != '\0')) &&
               (puVar1 = (ushort *)((long)this->extraData + (ulong)(uVar7 & 0xfffffffe)),
               UVar5 = ByteSinkUtil::appendChange
                                 (pbVar19,limit_00,(char16_t *)(puVar1 + 1),*puVar1 & 0x1f,sink,
                                  edits,errorCode), UVar5 != '\0')) goto LAB_00298fef;
          }
          else {
            if ((uVar2 < this->minNoNoEmpty) ||
               ((UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 == '\0' &&
                (UVar5 = hasCompBoundaryAfter(this,src,pbVar19,onlyContiguous), UVar5 == '\0'))))
            goto LAB_00298a8d;
            if ((src == pbVar19) ||
               (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode),
               UVar5 != '\0')) {
              if (edits != (Edits *)0x0) {
                Edits::addReplace(edits,iVar9 - uVar10,0);
              }
              goto LAB_00298fef;
            }
          }
        }
        else {
          if ((((uVar2 & 1) == 0) || ((onlyContiguous != '\0' && (2 < (uVar2 & 6))))) &&
             (UVar5 = hasCompBoundaryBefore(this,limit_00,limit), UVar5 == '\0')) goto LAB_00298a8d;
          if ((src == pbVar19) ||
             (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode),
             UVar5 != '\0')) {
            iVar16 = (uint)(uVar2 >> 3) - (uint)this->centerNoNoDelta;
            if (iVar9 - uVar10 == 1) {
              local_b0.impl =
                   (Normalizer2Impl *)CONCAT71(local_b0.impl._1_7_,(char)iVar16 + *pbVar19);
              newLength = 1;
            }
            else {
              bVar14 = limit_00[-1];
              if (((uint)bVar14 + iVar16 & 0xffffffc0) == 0x80) {
                pbVar17 = pbVar19 + 1;
                if (pbVar19 + 1 < limit_00 + -1) {
                  pbVar17 = limit_00 + -1;
                }
                memcpy(&local_b0,pbVar19,(long)pbVar17 - (long)pbVar19);
                newLength = ~uVar10 + (int)pbVar17 + 2;
                *(char *)((long)&local_b0.impl + ((long)pbVar17 - (long)pbVar19 & 0xffffffffU)) =
                     (char)((uint)bVar14 + iVar16);
              }
              else {
                UVar11 = anon_unknown_20::codePointFromValidUTF8(pbVar19,limit_00);
                uVar7 = UVar11 + iVar16;
                if (uVar7 < 0x80) {
                  local_b0.impl = (Normalizer2Impl *)CONCAT71(local_b0.impl._1_7_,(byte)uVar7);
                  newLength = 1;
                }
                else {
                  if (uVar7 < 0x800) {
                    local_b0.impl =
                         (Normalizer2Impl *)
                         (CONCAT71(local_b0.impl._1_7_,(char)(uVar7 >> 6)) | 0xc0);
                    uVar18 = 1;
                  }
                  else {
                    if (uVar7 < 0x10000) {
                      bVar14 = (byte)(uVar7 >> 0xc) | 0xe0;
                      lVar20 = 1;
                    }
                    else {
                      bVar14 = (byte)(uVar7 >> 0x12) | 0xf0;
                      local_b0.impl =
                           (Normalizer2Impl *)
                           ((ulong)(CONCAT61(local_b0.impl._2_6_,(char)(uVar7 >> 0xc)) &
                                    0xffffffffffff3f | 0x80) << 8);
                      lVar20 = 2;
                    }
                    local_b0.impl = (Normalizer2Impl *)CONCAT71(local_b0.impl._1_7_,bVar14);
                    uVar18 = (int)lVar20 + 1;
                    *(byte *)((long)&local_b0.impl + lVar20) = (byte)(uVar7 >> 6) & 0x3f | 0x80;
                  }
                  newLength = uVar18 + 1;
                  *(byte *)((long)&local_b0.impl + (ulong)uVar18) = (byte)uVar7 & 0x3f | 0x80;
                }
              }
            }
            if (edits != (Edits *)0x0) {
              Edits::addReplace(edits,iVar9 - uVar10,newLength);
            }
            (*sink->_vptr_ByteSink[2])(sink,&local_b0,(ulong)newLength);
            goto LAB_00298fef;
          }
        }
LAB_002990a2:
        UVar5 = '\x01';
        goto LAB_0029903f;
      }
      if (uVar7 != 0xfe00) {
        if (0xfe00 < uVar7) {
          uVar4 = uVar2 >> 1;
          if (onlyContiguous != '\0') {
            bVar14 = getPreviousTrailCC(this,src,pbVar19);
            local_c0 = (byte)uVar4;
            if (local_c0 < bVar14) {
              if (sink == (ByteSink *)0x0) goto LAB_0029908d;
              goto LAB_00298a8d;
            }
          }
          do {
            limit_00 = pbVar12;
            if (limit_00 == limit) {
              UVar5 = '\x01';
              if (sink != (ByteSink *)0x0) {
                ByteSinkUtil::appendUnchanged(src,limit,sink,options,edits,errorCode);
              }
              goto LAB_0029903f;
            }
            pbVar12 = limit_00 + 1;
            bVar14 = *limit_00;
            uVar7 = (uint)bVar14;
            if ((char)bVar14 < '\0') {
              if (pbVar12 != limit) {
                uVar7 = (uint)bVar14;
                if (bVar14 < 0xe0) {
                  if ((0xc1 < bVar14) && ((byte)(*pbVar12 ^ 0x80) < 0x40)) {
                    uVar7 = (uint)this->normTrie->index[uVar7 & 0x1f] + (*pbVar12 ^ 0x80);
LAB_0029887a:
                    pbVar12 = pbVar12 + 1;
                    goto LAB_002988f4;
                  }
                }
                else if (bVar14 < 0xf0) {
                  bVar14 = *pbVar12;
                  if (((((byte)" 000000000000\x1000"[uVar7 & 0xf] >> (bVar14 >> 5) & 1) != 0) &&
                      (pbVar12 = limit_00 + 2, pbVar12 != limit)) &&
                     ((byte)(*pbVar12 ^ 0x80) < 0x40)) {
                    uVar7 = (uint)*(ushort *)
                                   ((long)this->normTrie->index +
                                   (ulong)((uVar7 & 0xf) * 0x80 + (bVar14 & 0x3f) * 2)) +
                            (*pbVar12 ^ 0x80);
                    goto LAB_0029887a;
                  }
                }
                else if (bVar14 < 0xf5) {
                  bVar14 = *pbVar12;
                  if ((((((uint)(int)""[bVar14 >> 4] >> (uVar7 - 0xf0 & 0x1f) & 1) != 0) &&
                       (pbVar12 = limit_00 + 2, pbVar12 != limit)) &&
                      (bVar13 = *pbVar12, (byte)(bVar13 + 0x80) < 0x40)) &&
                     ((pbVar12 = limit_00 + 3, pbVar12 != limit && ((byte)(*pbVar12 + 0x80) < 0x40))
                     )) {
                    uVar7 = bVar14 & 0x3f | (uVar7 - 0xf0) * 0x40;
                    pUVar15 = this->normTrie;
                    if (uVar7 < pUVar15->shifted12HighStart) {
                      uVar7 = ucptrie_internalSmallU8Index_63
                                        (pUVar15,uVar7,bVar13 + 0x80,*pbVar12 + 0x80);
                    }
                    else {
                      uVar7 = pUVar15->dataLength - 2;
                    }
                    goto LAB_0029887a;
                  }
                }
              }
              uVar7 = this->normTrie->dataLength - 1;
            }
LAB_002988f4:
            uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar7 * 2);
            if (uVar3 < 0xfe02) goto LAB_00298e5b;
            local_c0 = (byte)uVar4;
            uVar4 = uVar3 >> 1;
          } while (local_c0 <= (byte)(uVar3 >> 1));
          if (sink == (ByteSink *)0x0) goto LAB_0029908d;
LAB_00298e5b:
          if ((uVar3 < this->minNoNoCompNoMaybeCC) ||
             ((this->limitNoNo <= uVar3 && (uVar3 < this->minMaybeYes)))) {
            local_d8 = src;
            if (this->minNoNo <= uVar3) {
              pbVar12 = limit_00;
            }
            goto LAB_00298fef;
          }
        }
LAB_00298a8d:
        if (((src != pbVar19) && (this->minNoNoCompNoMaybeCC <= uVar2)) &&
           ((uVar2 < this->limitNoNo || (this->minMaybeYes <= uVar2)))) {
          pbVar17 = pbVar19 + -1;
          bVar14 = pbVar19[-1];
          uVar7 = (uint)bVar14;
          pUVar15 = this->normTrie;
          if ((char)bVar14 < '\0') {
            uVar7 = ucptrie_internalU8PrevIndex_63(pUVar15,(uint)bVar14,src,pbVar17);
            pbVar17 = pbVar17 + -(ulong)(uVar7 & 7);
            uVar7 = (int)uVar7 >> 3;
            pUVar15 = this->normTrie;
          }
          uVar2 = *(ushort *)((long)(pUVar15->data).ptr0 + (long)(int)uVar7 * 2);
          if ((uVar2 & 1) == 0) goto LAB_00298aea;
          if ((onlyContiguous != '\0') && (uVar2 != 1)) {
            if (uVar2 < this->limitNoNo) {
              if (0x1ff < *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffe))) {
LAB_00298aea:
                pbVar19 = pbVar17;
              }
            }
            else if (2 < (uVar2 & 6)) goto LAB_00298aea;
          }
        }
        local_b0.str = &local_70;
        local_b0.impl = this;
        local_b0.start = UnicodeString::getBuffer(local_b0.str,8);
        local_b0.remainingCapacity = 0x1b;
        if ((((local_b0.str)->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
          local_b0.remainingCapacity = ((local_b0.str)->fUnion).fFields.fCapacity;
        }
        local_b0.lastCC = '\0';
        local_b0.reorderStart = local_b0.start;
        local_b0.limit = local_b0.start;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR && local_b0.start == (char16_t *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          decomposeShort(this,pbVar19,limit_00,'\0',onlyContiguous,&local_b0,errorCode);
          pbVar12 = decomposeShort(this,limit_00,limit,'\x01',onlyContiguous,&local_b0,errorCode);
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            if ((long)pbVar12 - (long)pbVar19 < 0x80000000) {
              recompose(this,&local_b0,0,onlyContiguous);
              UVar5 = ReorderingBuffer::equals(&local_b0,pbVar19,pbVar12);
              local_d8 = src;
              if (UVar5 == '\0') {
                if (sink == (ByteSink *)0x0) {
                  UVar5 = '\0';
                  goto LAB_002990b5;
                }
                if (((src != pbVar19) &&
                    (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode)
                    , UVar5 == '\0')) ||
                   (UVar5 = ByteSinkUtil::appendChange
                                      (pbVar19,pbVar12,local_b0.start,
                                       (int32_t)((ulong)((long)local_b0.limit - (long)local_b0.start
                                                        ) >> 1),sink,edits,errorCode),
                   local_d8 = pbVar12, UVar5 == '\0')) goto LAB_00299098;
              }
              ReorderingBuffer::~ReorderingBuffer(&local_b0);
              goto LAB_00298fef;
            }
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            UVar5 = '\x01';
LAB_002990b5:
            ReorderingBuffer::~ReorderingBuffer(&local_b0);
            goto LAB_0029903f;
          }
        }
LAB_00299098:
        ReorderingBuffer::~ReorderingBuffer(&local_b0);
        goto LAB_002990a2;
      }
      uVar7 = 0xffffffff;
      if ((2 < (long)pbVar19 - (long)src) && (bVar14 = pbVar19[-3], (byte)(bVar14 + 0x1f) < 0xd)) {
        bVar13 = (byte)(pbVar19[-2] ^ 0x80);
        if (((bVar13 < 0x40) && ((byte)(pbVar19[-1] ^ 0x80) < 0x40)) &&
           ((bVar14 < 0xed || (bVar13 < 0x20)))) {
          uVar7 = (pbVar19[-2] ^ 0x80) << 6 | (bVar14 & 0xf) << 0xc | pbVar19[-1] ^ 0x80;
        }
      }
      if (*pbVar17 != 0x85) {
        uVar10 = uVar7 - 0xac00;
        if ((0x2ba3 < uVar10) ||
           (uVar18 = (uVar10 & 0xffff) >> 2,
           (short)uVar10 != (short)((short)(uVar18 / 7) * 0x1b + (short)(uVar18 / 7))))
        goto LAB_00298a8d;
        if (sink != (ByteSink *)0x0) {
          iVar8 = anon_unknown_20::getJamoTMinusBase(pbVar19,limit_00);
          pbVar19 = pbVar19 + -3;
          if ((src == pbVar19) ||
             (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode),
             UVar5 != '\0')) {
            ByteSinkUtil::appendCodePoint(iVar9 - (int)pbVar19,iVar8 + uVar7,sink,edits);
            goto LAB_00298fef;
          }
          goto LAB_002990a2;
        }
LAB_0029908d:
        UVar5 = '\0';
        goto LAB_0029903f;
      }
      if (0x12 < uVar7 - 0x1100) goto LAB_00298a8d;
      if (sink == (ByteSink *)0x0) goto LAB_0029908d;
      iVar8 = anon_unknown_20::getJamoTMinusBase(limit_00,limit);
      if (iVar8 < 0) {
        UVar5 = hasCompBoundaryBefore(this,limit_00,limit);
        iVar9 = 0xac00;
        if (UVar5 == '\0') goto LAB_00298a8d;
      }
      else {
        limit_00 = limit_00 + 3;
        iVar9 = iVar8 + 0xac00;
      }
      bVar14 = pbVar19[2];
      pbVar19 = pbVar19 + -3;
      if ((src != pbVar19) &&
         (UVar5 = ByteSinkUtil::appendUnchanged(src,pbVar19,sink,options,edits,errorCode),
         UVar5 == '\0')) goto LAB_002990a2;
      ByteSinkUtil::appendCodePoint
                ((int)limit_00 - (int)pbVar19,
                 iVar9 + (uVar7 - 0x1100) * 0x24c + (uint)bVar14 * 0x1c + -0x119c,sink,edits);
      pbVar12 = limit_00;
      local_d8 = limit_00;
LAB_00298fef:
      src = local_d8;
      pbVar19 = pbVar12;
    } while (pbVar12 != limit);
  }
LAB_00299013:
  UVar5 = '\x01';
  if ((sink != (ByteSink *)0x0) && (src != limit)) {
    ByteSinkUtil::appendUnchanged(src,limit,sink,options,edits,errorCode);
  }
LAB_0029903f:
  UnicodeString::~UnicodeString(&local_70);
  return UVar5;
}

Assistant:

UBool
Normalizer2Impl::composeUTF8(uint32_t options, UBool onlyContiguous,
                             const uint8_t *src, const uint8_t *limit,
                             ByteSink *sink, Edits *edits, UErrorCode &errorCode) const {
    U_ASSERT(limit != nullptr);
    UnicodeString s16;
    uint8_t minNoMaybeLead = leadByteForCP(minCompNoMaybeCP);
    const uint8_t *prevBoundary = src;

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const uint8_t *prevSrc;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && sink != nullptr) {
                    ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                  *sink, options, edits, errorCode);
                }
                return TRUE;
            }
            if (*src < minNoMaybeLead) {
                ++src;
            } else {
                prevSrc = src;
                UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
                if (!isCompYesAndZeroCC(norm16)) {
                    break;
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (sink == nullptr) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    appendCodePointDelta(prevSrc, src, getAlgorithmicDelta(norm16), *sink, edits);
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    const uint16_t *mapping = getMapping(norm16);
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if (!ByteSinkUtil::appendChange(prevSrc, src, (const UChar *)mapping, length,
                                                    *sink, edits, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    if (edits != nullptr) {
                        edits->addReplace((int32_t)(src - prevSrc), 0);
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16)) {
            // Jamo L: E1 84 80..92
            // Jamo V: E1 85 A1..B5
            // Jamo T: E1 86 A8..E1 87 82
            U_ASSERT((src - prevSrc) == 3 && *prevSrc == 0xe1);
            UChar32 prev = previousHangulOrJamo(prevBoundary, prevSrc);
            if (prevSrc[1] == 0x85) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar32 l = prev - Hangul::JAMO_L_BASE;
                if ((uint32_t)l < Hangul::JAMO_L_COUNT) {
                    if (sink == nullptr) {
                        return FALSE;
                    }
                    int32_t t = getJamoTMinusBase(src, limit);
                    if (t >= 0) {
                        // The next character is a Jamo T.
                        src += 3;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (prevSrc[2]-0xa1)) *
                            Hangul::JAMO_T_COUNT + t;
                        prevSrc -= 3;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc &&
                                !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                               *sink, options, edits, errorCode)) {
                            break;
                        }
                        ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (sink == nullptr) {
                    return FALSE;
                }
                UChar32 syllable = prev + getJamoTMinusBase(prevSrc, src);
                prevSrc -= 3;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc &&
                        !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                       *sink, options, edits, errorCode)) {
                    break;
                }
                ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (sink == nullptr) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const uint8_t *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (sink != nullptr) {
                            ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                          *sink, options, edits, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (sink == nullptr) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const uint8_t *p = prevSrc;
            UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, prevBoundary, p, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        ReorderingBuffer buffer(*this, s16, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, 0, onlyContiguous);
        if (!buffer.equals(prevSrc, src)) {
            if (sink == nullptr) {
                return FALSE;
            }
            if (prevBoundary != prevSrc &&
                    !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                   *sink, options, edits, errorCode)) {
                break;
            }
            if (!ByteSinkUtil::appendChange(prevSrc, src, buffer.getStart(), buffer.length(),
                                            *sink, edits, errorCode)) {
                break;
            }
            prevBoundary = src;
        }
    }
    return TRUE;
}